

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall
RCO::getFileData(RCO *this,uint8_t **filedata,uint32_t *outlen,uint32_t offset,uint32_t size,
                bool isCompressed,uint32_t originalSize)

{
  void *pvVar1;
  uint8_t *deflated_final;
  uLongf destlen;
  uint8_t *deflated;
  uint8_t *fdata;
  uint local_30;
  uint32_t uStack_2c;
  bool isCompressed_local;
  uint32_t size_local;
  uint32_t offset_local;
  uint32_t *outlen_local;
  uint8_t **filedata_local;
  RCO *this_local;
  
  fdata._7_1_ = isCompressed;
  local_30 = size;
  uStack_2c = offset;
  _size_local = outlen;
  outlen_local = (uint32_t *)filedata;
  filedata_local = &this->mBuffer;
  pvVar1 = operator_new__((ulong)size);
  *(void **)outlen_local = pvVar1;
  deflated = *(uint8_t **)outlen_local;
  *_size_local = local_30;
  memcpy(deflated,this->mBuffer + (ulong)uStack_2c + (ulong)(this->mHeader).file_table_off,
         (ulong)local_30);
  if (((fdata._7_1_ & 1) != 0) && (originalSize != 0)) {
    destlen = (uLongf)operator_new__((ulong)originalSize);
    deflated_final = (uint8_t *)(ulong)originalSize;
    uncompress(destlen,&deflated_final,deflated,local_30);
    pvVar1 = operator_new__((ulong)deflated_final);
    memcpy(pvVar1,(void *)destlen,(size_t)deflated_final);
    *(void **)outlen_local = pvVar1;
    *_size_local = (uint32_t)deflated_final;
    if (destlen != 0) {
      operator_delete__((void *)destlen);
    }
    if (deflated != (uint8_t *)0x0) {
      operator_delete__(deflated);
    }
  }
  return NO_ERROR;
}

Assistant:

RCOError RCO::getFileData(uint8_t **filedata, uint32_t &outlen, uint32_t offset, uint32_t size, bool isCompressed, uint32_t originalSize)
{
	*filedata = new uint8_t[size];

	uint8_t *fdata = *filedata;
	outlen = size;

	memcpy(fdata, mBuffer + mHeader.file_table_off + offset, size * sizeof(uint8_t));

	if (isCompressed)
	{
		if (originalSize <= 0)
			return NO_ERROR;

		uint8_t *deflated = new uint8_t[originalSize];

		uLongf destlen = originalSize;//1024 * 1024 * 10;

		uncompress(deflated, &destlen, fdata, size);

		uint8_t *deflated_final = new uint8_t[destlen];
		memcpy(deflated_final, deflated, destlen);

		*filedata = deflated_final;
		outlen = destlen;

		delete[] deflated;
		delete[] fdata;
	}

	return NO_ERROR;

}